

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

double vrna_urn(void)

{
  int iVar1;
  
  iVar1 = rand();
  return (double)iVar1 / 2147483647.0;
}

Assistant:

PUBLIC double
vrna_urn(void)
{
#ifdef HAVE_ERAND48
  extern double erand48(unsigned short[]);


  return erand48(xsubi);
#else
  return ((double)rand()) / RAND_MAX;
#endif
}